

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O3

void __thiscall r_exec::_Mem::stop(_Mem *this)

{
  pointer ptVar1;
  pointer ptVar2;
  int iVar3;
  _ReductionJob *this_00;
  TimeJob *job;
  pointer ptVar4;
  ulong uVar5;
  unique_lock<std::mutex> lock;
  DebugStream local_69;
  unique_lock<std::mutex> local_68;
  undefined1 local_58 [32];
  undefined1 local_38 [16];
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_stateMutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  if (this->state == RUNNING) {
    if (this->reduction_core_count != 0) {
      uVar5 = 0;
      do {
        this_00 = (_ReductionJob *)operator_new(0x18);
        (this_00->super__Object)._vptr__Object = (_func_int **)0x0;
        (this_00->super__Object).refCount.super___atomic_base<long>._M_i = 0;
        this_00->ijt = 0;
        _ReductionJob::_ReductionJob(this_00);
        (this_00->super__Object)._vptr__Object = (_func_int **)&PTR___Object_001c1228;
        pushReductionJob(this,this_00);
        uVar5 = uVar5 + 1;
      } while (uVar5 < this->reduction_core_count);
    }
    if (this->time_core_count != 0) {
      uVar5 = 0;
      do {
        job = (TimeJob *)operator_new(0x20);
        ShutdownTimeCore::ShutdownTimeCore((ShutdownTimeCore *)job);
        if (this->state == STOPPED) {
          (*(job->super__Object)._vptr__Object[1])(job);
        }
        else {
          JobQueue<r_exec::TimeJob>::pushJob(&this->m_timeJobQueue,job);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < this->time_core_count);
    }
    this->state = STOPPED;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_stateMutex);
    if ((this->m_coreThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->m_coreThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar5 = 0;
      do {
        std::thread::join();
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)((long)(this->m_coreThreads).
                                     super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->m_coreThreads).
                                     super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3));
    }
    local_68._M_device = &this->m_coreCountMutex;
    local_68._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_68);
    local_68._M_owns = true;
    if ((this->m_coreCount).super___atomic_base<unsigned_long>._M_i != 0) {
      do {
        std::condition_variable::wait((unique_lock *)&this->m_coresRunning);
      } while ((this->m_coreCount).super___atomic_base<unsigned_long>._M_i != 0);
    }
    ptVar1 = (this->m_coreThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ptVar2 = (this->m_coreThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    ptVar4 = ptVar1;
    if (ptVar2 != ptVar1) {
      do {
        if ((ptVar4->_M_id)._M_thread != 0) {
          std::terminate();
        }
        ptVar4 = ptVar4 + 1;
      } while (ptVar4 != ptVar2);
      (this->m_coreThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = ptVar1;
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_68);
  }
  else {
    local_58._16_8_ = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_58 + 0x10),"mem","");
    local_68._M_device = (mutex_type *)local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,local_58._16_8_,
               (undefined1 *)((long)(__pthread_internal_list **)local_58._24_8_ + local_58._16_8_));
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)&s_debugSection);
    if (iVar3 != 0) {
      std::__throw_system_error(iVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_68._M_device,
               CONCAT71(local_68._9_7_,local_68._M_owns));
    if (local_68._M_device != (mutex_type *)local_58) {
      operator_delete(local_68._M_device);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"memory asked to stop while not running",0x26);
    DebugStream::~DebugStream(&local_69);
    if ((undefined1 *)local_58._16_8_ != local_38) {
      operator_delete((void *)local_58._16_8_);
    }
  }
  return;
}

Assistant:

void _Mem::stop()
{
    m_stateMutex.lock();

    if (state != RUNNING) {
        ::debug("mem") << "memory asked to stop while not running";
        return;
    }

    // We need to do this because things are wait()ing
    uint64_t i;

    for (i = 0; i < reduction_core_count; ++i) {
        pushReductionJob(new ShutdownReductionCore());
    }

    for (i = 0; i < time_core_count; ++i) {
        pushTimeJob(new ShutdownTimeCore());
    }

    state = STOPPED;
    m_stateMutex.unlock();

    for (i = 0; i < m_coreThreads.size(); ++i) {
        m_coreThreads[i].join();
    }

    std::unique_lock<std::mutex> lock(m_coreCountMutex);

    while (m_coreCount > 0) {
        m_coresRunning.wait(lock);
    }

    m_coreThreads.clear();
}